

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsCutGeneration.cpp
# Opt level: O0

bool __thiscall
HighsCutGeneration::cmirCutGenerationHeuristic
          (HighsCutGeneration *this,double minEfficacy,bool onlyInitialCMIRScale)

{
  const_iterator __last;
  ulong uVar1;
  bool bVar2;
  reference pvVar3;
  reference pvVar4;
  double *pdVar5;
  size_type sVar6;
  reference pdVar7;
  reference piVar8;
  byte in_SIL;
  long in_RDI;
  vector<double,_std::allocator<double>_> *this_00;
  double in_XMM0_Qa;
  double extraout_XMM0_Qa;
  double dVar9;
  HighsCDouble aj_3;
  HighsCDouble fj_3;
  double downaj_3;
  HighsCDouble scalaj_3;
  HighsInt j_3;
  HighsCDouble oneoveroneminusf0;
  HighsCDouble f0;
  double downrhs;
  HighsCDouble scalrhs;
  HighsCDouble scale;
  double efficacy_2;
  double aj_2;
  double fj_2;
  double downaj_2;
  double scalaj_2;
  HighsInt j_2;
  iterator __end2_2;
  iterator __begin2_2;
  vector<int,_std::allocator<int>_> *__range2_2;
  double viol_2;
  double sqrnorm_2;
  double oneoveroneminusf0_3;
  double f0_4;
  double downrhs_4;
  double scalrhs_4;
  double scale_3;
  double delta_3;
  HighsInt k_1;
  iterator __end1_1;
  iterator __begin1_1;
  vector<int,_std::allocator<int>_> *__range1_1;
  double efficacy_1;
  double aj_1;
  double fj_1;
  double downaj_1;
  double scalaj_1;
  HighsInt j_1;
  iterator __end2_1;
  iterator __begin2_1;
  vector<int,_std::allocator<int>_> *__range2_1;
  double viol_1;
  double sqrnorm_1;
  double oneoveroneminusf0_2;
  double f0_3;
  double downrhs_3;
  double scalrhs_3;
  double scale_2;
  double delta_2;
  HighsInt k;
  double efficacy;
  double aj;
  double fj;
  double downaj;
  double scalaj;
  HighsInt j;
  iterator __end2;
  iterator __begin2;
  vector<int,_std::allocator<int>_> *__range2;
  double viol;
  double sqrnorm;
  double oneoveroneminusf0_1;
  double f0_2;
  double downrhs_2;
  double scalrhs_2;
  double scale_1;
  double delta_1;
  iterator __end1;
  iterator __begin1;
  vector<double,_std::allocator<double>_> *__range1;
  double bestefficacy;
  double bestdelta;
  size_t i_1;
  double curdelta;
  double f0_1;
  double downrhs_1;
  double scalrhs_1;
  double intScale;
  double delta;
  HighsInt i;
  double f0max;
  double f0min;
  double maxCMirScale;
  double maxabsdelta;
  double continuoussqrnorm;
  double continuouscontribution;
  HighsCDouble *in_stack_fffffffffffffb78;
  HighsCDouble *in_stack_fffffffffffffb80;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_fffffffffffffb88;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_fffffffffffffb90;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_fffffffffffffb98;
  HighsInt index;
  undefined7 in_stack_fffffffffffffba0;
  undefined1 in_stack_fffffffffffffba7;
  undefined1 uVar10;
  const_iterator in_stack_fffffffffffffba8;
  HighsCutGeneration *in_stack_fffffffffffffbb0;
  HighsCDouble local_410;
  HighsCDouble local_400;
  HighsCDouble local_3f0;
  HighsCDouble local_3e0;
  HighsCDouble local_3d0;
  double local_3c0;
  HighsCDouble local_3b8;
  HighsCDouble local_3a8;
  int local_394;
  HighsCDouble local_390;
  HighsCDouble local_380;
  HighsCDouble local_370;
  HighsCDouble local_360;
  double local_350;
  HighsCDouble local_348;
  HighsCDouble local_338;
  HighsCDouble local_328;
  double local_318;
  double local_310;
  double local_308;
  double local_300;
  double local_2f8;
  HighsCDouble *local_2f0;
  double local_2e8;
  int local_2dc;
  int *local_2d8;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_2d0;
  long local_2c8;
  HighsCDouble *local_2c0;
  double local_2b8;
  double local_2b0;
  double local_2a8;
  double local_2a0;
  double local_298;
  double local_290;
  double local_288;
  int local_27c;
  int *local_278;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_270;
  long local_268;
  double local_260;
  double local_258;
  double local_250;
  double local_248;
  double local_240;
  vector<double,_std::allocator<double>_> *local_238;
  double local_230;
  int local_224;
  int *local_220;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_218;
  long local_210;
  HighsCDouble *local_208;
  double local_200;
  double local_1f8;
  double local_1f0;
  double local_1e8;
  double local_1e0;
  double local_1d8;
  double local_1d0;
  int local_1c4;
  double local_1c0;
  double local_1b8;
  double local_1b0;
  double local_1a8;
  double local_1a0;
  HighsCutGeneration *local_198;
  double local_190;
  int local_184;
  int *local_180;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_178;
  long local_170;
  double *local_168;
  double local_160;
  double local_158;
  double local_150;
  double local_148;
  double local_140;
  double local_138;
  double local_130;
  double *local_128;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_120;
  long local_118;
  double local_110;
  double local_108;
  double *local_100;
  double *local_f8;
  undefined8 local_e8;
  double *local_e0;
  double *local_d8;
  double *local_d0;
  ulong local_c0;
  value_type local_b8;
  double *local_b0;
  double *local_a8;
  double local_a0;
  double local_98;
  double local_90;
  double local_88;
  double local_80;
  double local_78;
  double local_70;
  double local_68;
  double local_60;
  int local_54;
  undefined8 local_50;
  undefined8 local_48;
  undefined8 local_40;
  double local_38;
  double local_30;
  double local_28;
  byte local_19;
  double local_18;
  bool local_1;
  
  local_19 = in_SIL & 1;
  *(undefined1 *)(in_RDI + 0xe0) = 0;
  *(undefined1 *)(in_RDI + 0xe1) = 0;
  local_28 = 0.0;
  local_30 = 0.0;
  local_18 = in_XMM0_Qa;
  std::vector<double,_std::allocator<double>_>::clear
            ((vector<double,_std::allocator<double>_> *)0x58e9a3);
  std::vector<double,_std::allocator<double>_>::reserve
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffbb0,
             (size_type)in_stack_fffffffffffffba8._M_current);
  std::vector<int,_std::allocator<int>_>::clear((vector<int,_std::allocator<int>_> *)0x58e9d4);
  std::vector<int,_std::allocator<int>_>::reserve
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffbb0,
             (size_type)in_stack_fffffffffffffba8._M_current);
  local_38 = 0.0;
  local_40 = 0x412e848000000000;
  local_48 = 0x3f747ae147ae147b;
  local_50 = 0x3fefd70a3d70a3d7;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT17(in_stack_fffffffffffffba7,in_stack_fffffffffffffba0),
             (size_type)in_stack_fffffffffffffb98._M_current);
  for (local_54 = 0; local_54 != *(int *)(in_RDI + 0xe4); local_54 = local_54 + 1) {
    pvVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(in_RDI + 0x98),
                        (long)local_54);
    if (*pvVar3 == '\0') {
      updateViolationAndNorm
                (in_stack_fffffffffffffbb0,
                 (HighsInt)((ulong)in_stack_fffffffffffffba8._M_current >> 0x20),
                 (double)CONCAT17(in_stack_fffffffffffffba7,in_stack_fffffffffffffba0),
                 in_stack_fffffffffffffb98._M_current,in_stack_fffffffffffffb90._M_current);
    }
    else {
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffb90._M_current,
                 (value_type_conflict2 *)in_stack_fffffffffffffb88._M_current);
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x50),(long)local_54)
      ;
      dVar9 = *pvVar4;
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x68),(long)local_54)
      ;
      if (dVar9 < *pvVar4 * 2.0) {
        flipComplementation((HighsCutGeneration *)
                            CONCAT17(in_stack_fffffffffffffba7,in_stack_fffffffffffffba0),
                            (HighsInt)((ulong)in_stack_fffffffffffffb98._M_current >> 0x20));
      }
      if ((local_19 & 1) == 0) {
        this_00 = (vector<double,_std::allocator<double>_> *)(in_RDI + 0x68);
        pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](this_00,(long)local_54);
        if ((*(double *)(in_RDI + 0xb0) <= *pvVar4 && *pvVar4 != *(double *)(in_RDI + 0xb0)) &&
           (std::abs((int)this_00), 0.0001 < extraout_XMM0_Qa)) {
          if ((extraout_XMM0_Qa != local_38) || (NAN(extraout_XMM0_Qa) || NAN(local_38))) {
            pdVar5 = std::max<double>(&local_38,&local_60);
            local_38 = *pdVar5;
            std::vector<double,_std::allocator<double>_>::push_back
                      ((vector<double,_std::allocator<double>_> *)
                       in_stack_fffffffffffffb90._M_current,in_stack_fffffffffffffb88._M_current);
          }
        }
      }
    }
  }
  if (((local_30 == 0.0) && (!NAN(local_30))) &&
     (sVar6 = std::vector<double,_std::allocator<double>_>::size
                        ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x108)), 1 < sVar6)) {
    local_68 = HighsIntegers::integralScale
                         ((vector<double,_std::allocator<double>_> *)
                          in_stack_fffffffffffffb90._M_current,
                          (double)in_stack_fffffffffffffb88._M_current,
                          (double)in_stack_fffffffffffffb80);
    if (((local_68 != 0.0) || (NAN(local_68))) && (local_68 <= 10000.0)) {
      local_70 = HighsCDouble::operator_cast_to_double((HighsCDouble *)(in_RDI + 0xd0));
      local_70 = local_70 * local_68;
      local_78 = fast_floor(local_70);
      local_80 = local_70 - local_78;
      if ((0.005 <= local_80) && (local_80 <= 0.995)) {
        local_88 = 1.0 / local_68;
        std::vector<double,_std::allocator<double>_>::push_back
                  ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffb80,
                   &in_stack_fffffffffffffb78->hi);
      }
    }
  }
  local_90 = 1.0;
  std::min<double>(&local_90,(double *)(in_RDI + 0xe8));
  std::vector<double,_std::allocator<double>_>::push_back
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffb90._M_current,
             in_stack_fffffffffffffb88._M_current);
  dVar9 = local_38;
  if ((local_19 & 1) == 0) {
    local_a0 = 1.0;
    pdVar5 = std::min<double>(&local_a0,(double *)(in_RDI + 0xe8));
    local_98 = dVar9 + *pdVar5;
    std::vector<double,_std::allocator<double>_>::push_back
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffb80,
               &in_stack_fffffffffffffb78->hi);
  }
  bVar2 = std::vector<double,_std::allocator<double>_>::empty
                    ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffb90._M_current
                    );
  if (bVar2) {
    local_1 = false;
  }
  else {
    local_a8 = (double *)
               std::vector<double,_std::allocator<double>_>::begin
                         ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffb78);
    local_b0 = (double *)
               std::vector<double,_std::allocator<double>_>::end
                         ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffb78);
    pdqsort<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
              (in_stack_fffffffffffffb90,in_stack_fffffffffffffb88);
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x108),0);
    local_b8 = *pvVar4;
    for (local_c0 = 1; uVar1 = local_c0,
        sVar6 = std::vector<double,_std::allocator<double>_>::size
                          ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x108)),
        uVar1 < sVar6; local_c0 = local_c0 + 1) {
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x108),local_c0);
      if (*(double *)(in_RDI + 0xb0) * 10.0 < *pvVar4 - local_b8) {
        pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x108),local_c0);
        local_b8 = *pvVar4;
      }
      else {
        pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x108),local_c0);
        *pvVar4 = 0.0;
      }
    }
    local_d8 = (double *)
               std::vector<double,_std::allocator<double>_>::begin
                         ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffb78);
    local_e0 = (double *)
               std::vector<double,_std::allocator<double>_>::end
                         ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffb78);
    local_e8 = 0;
    local_d0 = (double *)
               std::
               remove<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,double>
                         (in_stack_fffffffffffffb98,in_stack_fffffffffffffb90,
                          in_stack_fffffffffffffb88._M_current);
    __gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>::
    __normal_iterator<double*>
              ((__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_> *)
               in_stack_fffffffffffffb80,
               (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> *)
               in_stack_fffffffffffffb78);
    local_f8 = (double *)
               std::vector<double,_std::allocator<double>_>::end
                         ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffb78);
    __gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>::
    __normal_iterator<double*>
              ((__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_> *)
               in_stack_fffffffffffffb80,
               (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> *)
               in_stack_fffffffffffffb78);
    __last._M_current._7_1_ = in_stack_fffffffffffffba7;
    __last._M_current._0_7_ = in_stack_fffffffffffffba0;
    local_100 = (double *)
                std::vector<double,_std::allocator<double>_>::erase
                          (in_stack_fffffffffffffb98._M_current,in_stack_fffffffffffffba8,__last);
    local_108 = -1.0;
    local_110 = local_18;
    local_118 = in_RDI + 0x108;
    local_120._M_current =
         (double *)
         std::vector<double,_std::allocator<double>_>::begin
                   ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffb78);
    local_128 = (double *)
                std::vector<double,_std::allocator<double>_>::end
                          ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffb78);
    while (bVar2 = __gnu_cxx::operator!=
                             ((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
                               *)in_stack_fffffffffffffb80,
                              (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
                               *)in_stack_fffffffffffffb78), bVar2) {
      pdVar7 = __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
               ::operator*(&local_120);
      local_130 = *pdVar7;
      local_138 = 1.0 / local_130;
      local_140 = HighsCDouble::operator_cast_to_double((HighsCDouble *)(in_RDI + 0xd0));
      local_140 = local_140 * local_138;
      local_148 = fast_floor(local_140);
      local_150 = local_140 - local_148;
      if (((0.005 <= local_150) && (local_150 <= 0.995)) &&
         (local_158 = 1.0 / (1.0 - local_150), local_158 <= 1000000.0)) {
        local_160 = local_138 * local_138 * local_30;
        local_168 = (double *)(local_138 * local_28 * local_158 + -local_148);
        local_170 = in_RDI + 0xf0;
        local_178._M_current =
             (int *)std::vector<int,_std::allocator<int>_>::begin
                              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffb78);
        local_180 = (int *)std::vector<int,_std::allocator<int>_>::end
                                     ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffb78
                                     );
        while (bVar2 = __gnu_cxx::operator!=
                                 ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                                   *)in_stack_fffffffffffffb80,
                                  (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                                   *)in_stack_fffffffffffffb78), bVar2) {
          piVar8 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                   operator*(&local_178);
          local_184 = *piVar8;
          local_190 = *(double *)(*(long *)(in_RDI + 0xc0) + (long)local_184 * 8) * local_138;
          in_stack_fffffffffffffbb0 = (HighsCutGeneration *)fast_floor(local_190 + 1e-14);
          local_1a0 = local_190 - (double)in_stack_fffffffffffffbb0;
          local_1b0 = 0.0;
          local_1b8 = local_1a0 - local_150;
          local_198 = in_stack_fffffffffffffbb0;
          pdVar5 = std::max<double>(&local_1b0,&local_1b8);
          local_1a8 = (double)in_stack_fffffffffffffbb0 + *pdVar5;
          updateViolationAndNorm
                    (in_stack_fffffffffffffbb0,
                     (HighsInt)((ulong)in_stack_fffffffffffffba8._M_current >> 0x20),
                     (double)CONCAT17(in_stack_fffffffffffffba7,in_stack_fffffffffffffba0),
                     in_stack_fffffffffffffb98._M_current,in_stack_fffffffffffffb90._M_current);
          __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                    (&local_178);
        }
        in_stack_fffffffffffffba8._M_current = local_168;
        local_1c0 = sqrt(local_160);
        local_1c0 = (double)in_stack_fffffffffffffba8._M_current / local_1c0;
        if (local_110 < local_1c0) {
          local_108 = local_130;
          local_110 = local_1c0;
        }
      }
      __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
      operator++(&local_120);
    }
    if ((local_108 != -1.0) || (NAN(local_108))) {
      for (local_1c4 = 1; bVar2 = (local_19 & 1) == 0, uVar10 = bVar2 && local_1c4 < 4,
          bVar2 && local_1c4 < 4; local_1c4 = local_1c4 + 1) {
        local_1d0 = local_108 * (double)(1 << ((byte)local_1c4 & 0x1f));
        local_1d8 = 1.0 / local_1d0;
        local_1e0 = HighsCDouble::operator_cast_to_double((HighsCDouble *)(in_RDI + 0xd0));
        local_1e0 = local_1e0 * local_1d8;
        local_1e8 = fast_floor(local_1e0);
        local_1f0 = local_1e0 - local_1e8;
        if (((0.005 <= local_1f0) && (local_1f0 <= 0.995)) &&
           (local_1f8 = 1.0 / (1.0 - local_1f0), local_1f8 <= 1000000.0)) {
          local_200 = local_1d8 * local_1d8 * local_30;
          local_208 = (HighsCDouble *)(local_1d8 * local_28 * local_1f8 + -local_1e8);
          local_210 = in_RDI + 0xf0;
          local_218._M_current =
               (int *)std::vector<int,_std::allocator<int>_>::begin
                                ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffb78);
          local_220 = (int *)std::vector<int,_std::allocator<int>_>::end
                                       ((vector<int,_std::allocator<int>_> *)
                                        in_stack_fffffffffffffb78);
          while (bVar2 = __gnu_cxx::operator!=
                                   ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                                     *)in_stack_fffffffffffffb80,
                                    (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                                     *)in_stack_fffffffffffffb78), bVar2) {
            piVar8 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                     operator*(&local_218);
            local_224 = *piVar8;
            local_230 = *(double *)(*(long *)(in_RDI + 0xc0) + (long)local_224 * 8) * local_1d8;
            in_stack_fffffffffffffb98._M_current = (double *)fast_floor(local_230 + 1e-14);
            local_240 = local_230 - (double)in_stack_fffffffffffffb98._M_current;
            local_250 = 0.0;
            local_258 = local_240 - local_1f0;
            local_238 = (vector<double,_std::allocator<double>_> *)
                        in_stack_fffffffffffffb98._M_current;
            pdVar5 = std::max<double>(&local_250,&local_258);
            local_248 = (double)in_stack_fffffffffffffb98._M_current + *pdVar5;
            updateViolationAndNorm
                      (in_stack_fffffffffffffbb0,
                       (HighsInt)((ulong)in_stack_fffffffffffffba8._M_current >> 0x20),
                       (double)CONCAT17(uVar10,in_stack_fffffffffffffba0),
                       in_stack_fffffffffffffb98._M_current,in_stack_fffffffffffffb90._M_current);
            __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                      (&local_218);
          }
          in_stack_fffffffffffffb90._M_current = &local_208->hi;
          local_260 = sqrt(local_200);
          local_260 = (double)in_stack_fffffffffffffb90._M_current / local_260;
          if (local_110 < local_260) {
            local_108 = local_1d0;
            local_110 = local_260;
          }
        }
      }
      local_268 = in_RDI + 0xf0;
      local_270._M_current =
           (int *)std::vector<int,_std::allocator<int>_>::begin
                            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffb78);
      local_278 = (int *)std::vector<int,_std::allocator<int>_>::end
                                   ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffb78);
      while (bVar2 = __gnu_cxx::operator!=
                               ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *
                                )in_stack_fffffffffffffb80,
                                (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *
                                )in_stack_fffffffffffffb78), bVar2) {
        piVar8 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                 operator*(&local_270);
        local_27c = *piVar8;
        pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x50),
                            (long)local_27c);
        if (((*pvVar4 != INFINITY) || (dVar9 = local_110, NAN(*pvVar4))) &&
           (pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                               ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x68),
                                (long)local_27c), dVar9 = local_110,
           *(double *)(in_RDI + 0xb0) < *pvVar4)) {
          flipComplementation((HighsCutGeneration *)CONCAT17(uVar10,in_stack_fffffffffffffba0),
                              (HighsInt)((ulong)in_stack_fffffffffffffb98._M_current >> 0x20));
          local_288 = local_108;
          local_290 = 1.0 / local_108;
          local_298 = HighsCDouble::operator_cast_to_double((HighsCDouble *)(in_RDI + 0xd0));
          local_298 = local_298 * local_290;
          local_2a0 = fast_floor(local_298);
          local_2a8 = local_298 - local_2a0;
          index = (HighsInt)((ulong)in_stack_fffffffffffffb98._M_current >> 0x20);
          if ((local_2a8 < 0.005) || (0.995 < local_2a8)) {
            flipComplementation((HighsCutGeneration *)CONCAT17(uVar10,in_stack_fffffffffffffba0),
                                index);
            dVar9 = local_110;
          }
          else {
            local_2b0 = 1.0 / (1.0 - local_2a8);
            if (local_2b0 <= 1000000.0) {
              local_2b8 = local_290 * local_290 * local_30;
              local_2c0 = (HighsCDouble *)(local_290 * local_28 * local_2b0 + -local_2a0);
              local_2c8 = in_RDI + 0xf0;
              local_2d0._M_current =
                   (int *)std::vector<int,_std::allocator<int>_>::begin
                                    ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffb78)
              ;
              local_2d8 = (int *)std::vector<int,_std::allocator<int>_>::end
                                           ((vector<int,_std::allocator<int>_> *)
                                            in_stack_fffffffffffffb78);
              while (bVar2 = __gnu_cxx::operator!=
                                       ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                                         *)in_stack_fffffffffffffb80,
                                        (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                                         *)in_stack_fffffffffffffb78), bVar2) {
                piVar8 = __gnu_cxx::
                         __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                         operator*(&local_2d0);
                local_2dc = *piVar8;
                local_2e8 = *(double *)(*(long *)(in_RDI + 0xc0) + (long)local_2dc * 8) * local_290;
                in_stack_fffffffffffffb88._M_current = (double *)fast_floor(local_2e8 + 1e-14);
                local_2f8 = local_2e8 - (double)in_stack_fffffffffffffb88._M_current;
                local_308 = 0.0;
                local_310 = local_2f8 - local_2a8;
                local_2f0 = (HighsCDouble *)in_stack_fffffffffffffb88._M_current;
                pdVar5 = std::max<double>(&local_308,&local_310);
                local_300 = (double)in_stack_fffffffffffffb88._M_current + *pdVar5;
                updateViolationAndNorm
                          (in_stack_fffffffffffffbb0,
                           (HighsInt)((ulong)in_stack_fffffffffffffba8._M_current >> 0x20),
                           (double)CONCAT17(uVar10,in_stack_fffffffffffffba0),
                           in_stack_fffffffffffffb98._M_current,in_stack_fffffffffffffb90._M_current
                          );
                __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                operator++(&local_2d0);
              }
              in_stack_fffffffffffffb80 = local_2c0;
              local_318 = sqrt(local_2b8);
              local_318 = (double)in_stack_fffffffffffffb80 / local_318;
              dVar9 = local_318;
              if (local_318 <= local_110) {
                flipComplementation((HighsCutGeneration *)CONCAT17(uVar10,in_stack_fffffffffffffba0)
                                    ,(HighsInt)((ulong)in_stack_fffffffffffffb98._M_current >> 0x20)
                                   );
                dVar9 = local_110;
              }
            }
            else {
              flipComplementation((HighsCutGeneration *)CONCAT17(uVar10,in_stack_fffffffffffffba0),
                                  index);
              dVar9 = local_110;
            }
          }
        }
        local_110 = dVar9;
        __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                  (&local_270);
      }
      HighsCDouble::HighsCDouble(&local_338,local_108);
      local_328 = operator/((double)in_stack_fffffffffffffb90._M_current,
                            (HighsCDouble *)in_stack_fffffffffffffb88._M_current);
      local_348 = HighsCDouble::operator*(in_stack_fffffffffffffb80,in_stack_fffffffffffffb78);
      dVar9 = HighsCDouble::operator_cast_to_double(&local_348);
      local_350 = floor(dVar9);
      local_360 = HighsCDouble::operator-
                            (in_stack_fffffffffffffb80,(double)in_stack_fffffffffffffb78);
      local_380 = ::operator-((double)in_stack_fffffffffffffb90._M_current,
                              (HighsCDouble *)in_stack_fffffffffffffb88._M_current);
      local_370 = operator/((double)in_stack_fffffffffffffb90._M_current,
                            (HighsCDouble *)in_stack_fffffffffffffb88._M_current);
      HighsCDouble::HighsCDouble(&local_390,local_350 * local_108);
      *(double *)(in_RDI + 0xd0) = local_390.hi;
      *(double *)(in_RDI + 0xd8) = local_390.lo;
      *(undefined1 *)(in_RDI + 0xe0) = 1;
      *(undefined1 *)(in_RDI + 0xe1) = 0;
      for (local_394 = 0; local_394 != *(int *)(in_RDI + 0xe4); local_394 = local_394 + 1) {
        dVar9 = *(double *)(*(long *)(in_RDI + 0xc0) + (long)local_394 * 8);
        if ((dVar9 != 0.0) || (NAN(dVar9))) {
          pvVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                             ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                              (in_RDI + 0x98),(long)local_394);
          if (*pvVar3 == '\0') {
            if (*(double *)(*(long *)(in_RDI + 0xc0) + (long)local_394 * 8) <= 0.0) {
              local_3a8 = ::operator*((double)in_stack_fffffffffffffb80,in_stack_fffffffffffffb78);
              dVar9 = HighsCDouble::operator_cast_to_double(&local_3a8);
              *(double *)(*(long *)(in_RDI + 0xc0) + (long)local_394 * 8) = dVar9;
              *(undefined1 *)(in_RDI + 0xe0) = 0;
            }
            else {
              *(undefined8 *)(*(long *)(in_RDI + 0xc0) + (long)local_394 * 8) = 0;
            }
          }
          else {
            local_3b8 = HighsCDouble::operator*
                                  ((HighsCDouble *)in_stack_fffffffffffffb90._M_current,
                                   (double)in_stack_fffffffffffffb88._M_current);
            local_3d0 = HighsCDouble::operator+
                                  (in_stack_fffffffffffffb80,(double)in_stack_fffffffffffffb78);
            dVar9 = HighsCDouble::operator_cast_to_double(&local_3d0);
            local_3c0 = floor(dVar9);
            local_3e0 = HighsCDouble::operator-
                                  (in_stack_fffffffffffffb80,(double)in_stack_fffffffffffffb78);
            HighsCDouble::HighsCDouble(&local_3f0,local_3c0);
            bVar2 = HighsCDouble::operator>(in_stack_fffffffffffffb80,in_stack_fffffffffffffb78);
            if (bVar2) {
              local_400 = HighsCDouble::operator-
                                    (in_stack_fffffffffffffb80,in_stack_fffffffffffffb78);
              HighsCDouble::operator+=(in_stack_fffffffffffffb80,in_stack_fffffffffffffb78);
            }
            local_410 = HighsCDouble::operator*
                                  ((HighsCDouble *)in_stack_fffffffffffffb90._M_current,
                                   (double)in_stack_fffffffffffffb88._M_current);
            dVar9 = HighsCDouble::operator_cast_to_double(&local_410);
            *(double *)(*(long *)(in_RDI + 0xc0) + (long)local_394 * 8) = dVar9;
          }
        }
      }
      local_1 = true;
    }
    else {
      local_1 = false;
    }
  }
  return local_1;
}

Assistant:

bool HighsCutGeneration::cmirCutGenerationHeuristic(double minEfficacy,
                                                    bool onlyInitialCMIRScale) {
  using std::abs;
  using std::floor;
  using std::max;
  using std::sqrt;

  // initialize indicators
  integralSupport = false;
  integralCoefficients = false;

  double continuouscontribution = 0.0;
  double continuoussqrnorm = 0.0;

  deltas.clear();
  deltas.reserve(rowlen + 3);
  integerinds.clear();
  integerinds.reserve(rowlen);

  double maxabsdelta = 0.0;
  constexpr double maxCMirScale = 1e6;
  constexpr double f0min = 0.005;
  constexpr double f0max = 0.995;

  complementation.resize(rowlen);

  for (HighsInt i = 0; i != rowlen; ++i) {
    if (isintegral[i]) {
      integerinds.push_back(i);

      if (upper[i] < 2 * solval[i]) flipComplementation(i);

      if (onlyInitialCMIRScale) continue;

      if (solval[i] > feastol) {
        double delta = abs(vals[i]);
        if (delta <= 1e-4 || delta == maxabsdelta) continue;
        maxabsdelta = max(maxabsdelta, delta);
        deltas.push_back(delta);
      }
    } else {
      updateViolationAndNorm(i, vals[i], continuouscontribution,
                             continuoussqrnorm);
    }
  }

  if (continuoussqrnorm == 0 && deltas.size() > 1) {
    double intScale = HighsIntegers::integralScale(deltas, feastol, kHighsTiny);

    if (intScale != 0.0 && intScale <= 1e4) {
      double scalrhs = double(rhs) * intScale;
      double downrhs = fast_floor(scalrhs);

      double f0 = scalrhs - downrhs;
      if (f0 >= f0min && f0 <= f0max) deltas.push_back(1.0 / intScale);
    }
  }

  deltas.push_back(std::min(1.0, initialScale));
  if (!onlyInitialCMIRScale)
    deltas.push_back(maxabsdelta + std::min(1.0, initialScale));

  if (deltas.empty()) return false;

  pdqsort(deltas.begin(), deltas.end());
  double curdelta = deltas[0];
  for (size_t i = 1; i < deltas.size(); ++i) {
    if (deltas[i] - curdelta <= 10 * feastol)
      deltas[i] = 0.0;
    else
      curdelta = deltas[i];
  }

  deltas.erase(std::remove(deltas.begin(), deltas.end(), 0.0), deltas.end());
  double bestdelta = -1;
  double bestefficacy = minEfficacy;

  for (double delta : deltas) {
    double scale = 1.0 / delta;
    double scalrhs = double(rhs) * scale;
    double downrhs = fast_floor(scalrhs);

    double f0 = scalrhs - downrhs;
    if (f0 < f0min || f0 > f0max) continue;
    double oneoveroneminusf0 = 1.0 / (1.0 - f0);
    if (oneoveroneminusf0 > maxCMirScale) continue;

    double sqrnorm = scale * scale * continuoussqrnorm;
    double viol = scale * continuouscontribution * oneoveroneminusf0 - downrhs;

    for (HighsInt j : integerinds) {
      double scalaj = vals[j] * scale;
      double downaj = fast_floor(scalaj + kHighsTiny);
      double fj = scalaj - downaj;
      double aj = downaj + std::max(0.0, fj - f0);
      updateViolationAndNorm(j, aj, viol, sqrnorm);
    }

    double efficacy = viol / sqrt(sqrnorm);
    if (efficacy > bestefficacy) {
      bestdelta = delta;
      bestefficacy = efficacy;
    }
  }

  if (bestdelta == -1) return false;

  /* try if multiplying best delta by 2 4 or 8 gives a better efficacy */
  for (HighsInt k = 1; !onlyInitialCMIRScale && k <= 3; ++k) {
    double delta = bestdelta * (1 << k);
    double scale = 1.0 / delta;
    double scalrhs = double(rhs) * scale;
    double downrhs = fast_floor(scalrhs);
    double f0 = scalrhs - downrhs;
    if (f0 < f0min || f0 > f0max) continue;

    double oneoveroneminusf0 = 1.0 / (1.0 - f0);
    if (oneoveroneminusf0 > maxCMirScale) continue;

    double sqrnorm = scale * scale * continuoussqrnorm;
    double viol = scale * continuouscontribution * oneoveroneminusf0 - downrhs;

    for (HighsInt j : integerinds) {
      double scalaj = vals[j] * scale;
      double downaj = fast_floor(scalaj + kHighsTiny);
      double fj = scalaj - downaj;
      double aj = downaj + std::max(0.0, fj - f0);
      updateViolationAndNorm(j, aj, viol, sqrnorm);
    }

    double efficacy = viol / sqrt(sqrnorm);
    if (efficacy > bestefficacy) {
      bestdelta = delta;
      bestefficacy = efficacy;
    }
  }

  assert(bestdelta != -1);

  // try to flip complementation of integers to increase efficacy
  for (HighsInt k : integerinds) {
    if (upper[k] == kHighsInf) continue;
    if (solval[k] <= feastol) continue;

    flipComplementation(k);

    double delta = bestdelta;
    double scale = 1.0 / delta;
    double scalrhs = double(rhs) * scale;
    double downrhs = fast_floor(scalrhs);

    double f0 = scalrhs - downrhs;
    if (f0 < f0min || f0 > f0max) {
      flipComplementation(k);
      continue;
    }

    double oneoveroneminusf0 = 1.0 / (1.0 - f0);
    if (oneoveroneminusf0 > maxCMirScale) {
      flipComplementation(k);
      continue;
    }

    double sqrnorm = scale * scale * continuoussqrnorm;
    double viol = scale * continuouscontribution * oneoveroneminusf0 - downrhs;

    for (HighsInt j : integerinds) {
      double scalaj = vals[j] * scale;
      double downaj = fast_floor(scalaj + kHighsTiny);
      double fj = scalaj - downaj;
      double aj = downaj + std::max(0.0, fj - f0);
      updateViolationAndNorm(j, aj, viol, sqrnorm);
    }

    double efficacy = viol / sqrt(sqrnorm);
    if (efficacy > bestefficacy) {
      bestefficacy = efficacy;
    } else {
      flipComplementation(k);
    }
  }

  HighsCDouble scale = 1.0 / HighsCDouble(bestdelta);
  HighsCDouble scalrhs = rhs * scale;
  double downrhs = floor(double(scalrhs));

  HighsCDouble f0 = scalrhs - downrhs;
  HighsCDouble oneoveroneminusf0 = 1.0 / (1.0 - f0);

  rhs = downrhs * bestdelta;
  integralSupport = true;
  integralCoefficients = false;
  for (HighsInt j = 0; j != rowlen; ++j) {
    if (vals[j] == 0.0) continue;
    if (!isintegral[j]) {
      if (vals[j] > 0.0)
        vals[j] = 0.0;
      else {
        vals[j] = double(vals[j] * oneoveroneminusf0);
        integralSupport = false;
      }
    } else {
      HighsCDouble scalaj = scale * vals[j];
      double downaj = floor(double(scalaj + kHighsTiny));
      HighsCDouble fj = scalaj - downaj;
      HighsCDouble aj = downaj;
      if (fj > f0) aj += fj - f0;

      vals[j] = double(aj * bestdelta);
    }
  }

  return true;
}